

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O2

void MemoryProfiler::PrintAll(void)

{
  MemoryProfiler *this;
  AutoPtr<MemoryProfiler,_Memory::NoCheckHeapAllocator> *pAVar1;
  
  Output::Print(
               L"========================================================================================================\n"
               );
  Output::Print(L"Memory Profile (All threads)\n");
  pAVar1 = &profilers;
  while (this = *(MemoryProfiler **)pAVar1, this != (MemoryProfiler *)0x0) {
    Print(this);
    pAVar1 = (AutoPtr<MemoryProfiler,_Memory::NoCheckHeapAllocator> *)&this->next;
  }
  Output::Flush();
  return;
}

Assistant:

void
MemoryProfiler::PrintAll()
{
    Output::Print(_u("========================================================================================================\n"));
    Output::Print(_u("Memory Profile (All threads)\n"));

    ForEachProfiler([] (MemoryProfiler * memoryProfiler)
    {
        memoryProfiler->Print();
    });

    Output::Flush();
}